

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  long lVar6;
  pointer pcVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  long *plVar12;
  char *__data_1;
  char *__data;
  long *plVar13;
  size_type __size;
  size_type __size_1;
  size_t __n;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_01397ff0;
  this->pos_ = 0;
  this->fd_ = fd;
  uVar14 = filename->_M_string_length;
  if (uVar14 != 0) {
    plVar13 = (long *)(filename->_M_dataplus)._M_p;
    __n = 0xffffffffffffffff;
    uVar10 = 0;
    plVar12 = plVar13;
    do {
      if (uVar14 == uVar10) goto LAB_00d0a62a;
      plVar1 = (long *)((long)plVar12 + -1);
      __n = __n + 1;
      uVar10 = uVar10 + 1;
      pcVar5 = (char *)((long)plVar12 + (uVar14 - 1));
      plVar12 = plVar1;
    } while (*pcVar5 != '/');
    if ((uVar14 - __n < uVar14) &&
       (pvVar11 = memchr((void *)(uVar14 + 1 + (long)plVar1),0x2f,__n),
       (long)pvVar11 - (long)plVar13 != -1 && pvVar11 != (void *)0x0)) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x1ad,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    plVar13 = (long *)(uVar14 + 1 + (long)plVar1);
    uVar14 = __n;
LAB_00d0a62a:
    if (7 < uVar14) {
      bVar15 = *plVar13 == 0x54534546494e414d;
      goto LAB_00d0a645;
    }
  }
  bVar15 = false;
LAB_00d0a645:
  this->is_manifest_ = bVar15;
  this_00 = &this->filename_;
  paVar4 = &(this->filename_).field_2;
  (this->filename_)._M_dataplus._M_p = (pointer)paVar4;
  pcVar7 = (filename->_M_dataplus)._M_p;
  paVar2 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar2) {
    uVar8 = *(undefined8 *)((long)&filename->field_2 + 8);
    paVar4->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filename_).field_2 + 8) = uVar8;
  }
  else {
    (this_00->_M_dataplus)._M_p = pcVar7;
    paVar4->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->filename_)._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar2;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  uVar14 = (this->filename_)._M_string_length;
  if (uVar14 == 0) {
LAB_00d0a720:
    (this->dirname_)._M_dataplus._M_p = (pointer)&(this->dirname_).field_2;
    *(undefined2 *)&(this->dirname_).field_2 = 0x2e;
    (this->dirname_)._M_string_length = 1;
  }
  else {
    pcVar7 = (this_00->_M_dataplus)._M_p;
    uVar10 = 0;
    do {
      if (uVar14 + uVar10 == 0) goto LAB_00d0a720;
      uVar3 = uVar10 - 1;
      lVar9 = uVar10 + (uVar14 - 1);
      uVar10 = uVar3;
    } while (pcVar7[lVar9] != '/');
    if ((uVar14 + uVar3 + 1 < uVar14) &&
       (pvVar11 = memchr(pcVar7 + uVar3 + uVar14 + 1,0x2f,~uVar3),
       (long)pvVar11 - (long)pcVar7 != -1 && pvVar11 != (void *)0x0)) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x19d,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&this->dirname_,this_00,0,uVar14 + uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}